

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O2

void * sapp_wgpu_get_depth_stencil_view(void)

{
  if (_sapp.valid) {
    return (void *)0x0;
  }
  __assert_fail("_sapp.valid",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_app.h"
                ,0x2b68,"const void *sapp_wgpu_get_depth_stencil_view(void)");
}

Assistant:

SOKOL_API_IMPL const void* sapp_wgpu_get_depth_stencil_view(void) {
    SOKOL_ASSERT(_sapp.valid);
    #if defined(_SAPP_EMSCRIPTEN) && defined(SOKOL_WGPU)
        return (const void*) _sapp.emsc.wgpu.depth_stencil_view;
    #else
        return 0;
    #endif
}